

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostref.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  wasm_valtype_t *p;
  wasm_valtype_t *r;
  wasm_functype_t *pwVar5;
  wasm_global_t *pwVar6;
  wasm_table_t *pwVar7;
  wasm_func_t *func;
  wasm_func_t *func_00;
  wasm_func_t *func_01;
  wasm_func_t *func_02;
  wasm_func_t *func_03;
  undefined8 uVar8;
  wasm_ref_t *expected;
  wasm_ref_t *pwVar9;
  wasm_ref_t *ref;
  wasm_val_t val;
  wasm_ref_t *host2;
  wasm_ref_t *host1;
  wasm_func_t *func_call;
  wasm_func_t *table_get;
  wasm_func_t *table_set;
  wasm_func_t *global_get;
  wasm_func_t *global_set;
  wasm_table_t *table;
  wasm_global_t *global;
  size_t i;
  wasm_extern_vec_t exports;
  wasm_instance_t *instance;
  wasm_extern_t *imports [1];
  wasm_func_t *callback_func;
  wasm_functype_t *callback_type;
  wasm_module_t *module;
  wasm_byte_vec_t binary;
  size_t file_size;
  FILE *file;
  wasm_store_t *store;
  wasm_engine_t *engine;
  char **argv_local;
  int argc_local;
  
  printf("Initializing...\n");
  uVar1 = wasm_engine_new();
  uVar2 = wasm_store_new(uVar1);
  printf("Loading binary...\n");
  __stream = fopen("hostref.wasm","r");
  if (__stream == (FILE *)0x0) {
    printf("> Error loading module!\n");
    argv_local._4_4_ = 1;
  }
  else {
    fseek(__stream,0,2);
    binary.data = (wasm_byte_t *)ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&module,binary.data);
    sVar3 = fread((void *)binary.size,(size_t)binary.data,1,__stream);
    if (sVar3 == 1) {
      fclose(__stream);
      printf("Compiling module...\n");
      lVar4 = wasm_module_new(uVar2,&module);
      if (lVar4 == 0) {
        printf("> Error compiling module!\n");
        argv_local._4_4_ = 1;
      }
      else {
        wasm_byte_vec_delete(&module);
        printf("Creating callback...\n");
        p = (wasm_valtype_t *)wasm_valtype_new(0x80);
        r = (wasm_valtype_t *)wasm_valtype_new(0x80);
        pwVar5 = wasm_functype_new_1_1(p,r);
        imports[0] = (wasm_extern_t *)wasm_func_new(uVar2,pwVar5,callback);
        wasm_functype_delete(pwVar5);
        printf("Instantiating module...\n");
        instance = (wasm_instance_t *)wasm_func_as_extern(imports[0]);
        exports.data = (wasm_extern_t **)wasm_instance_new(uVar2,lVar4,&instance,0);
        if (exports.data == (wasm_extern_t **)0x0) {
          printf("> Error instantiating module!\n");
          argv_local._4_4_ = 1;
        }
        else {
          wasm_func_delete(imports[0]);
          wasm_module_delete(lVar4);
          printf("Extracting exports...\n");
          wasm_instance_exports(exports.data,&i);
          pwVar6 = get_export_global((wasm_extern_vec_t *)&i,0);
          pwVar7 = get_export_table((wasm_extern_vec_t *)&i,1);
          func = get_export_func((wasm_extern_vec_t *)&i,2);
          func_00 = get_export_func((wasm_extern_vec_t *)&i,3);
          func_01 = get_export_func((wasm_extern_vec_t *)&i,4);
          func_02 = get_export_func((wasm_extern_vec_t *)&i,5);
          func_03 = get_export_func((wasm_extern_vec_t *)&i,6);
          wasm_instance_delete(exports.data);
          printf("Creating host references...\n");
          uVar8 = wasm_foreign_new(uVar2);
          expected = (wasm_ref_t *)wasm_foreign_as_ref(uVar8);
          uVar8 = wasm_foreign_new(uVar2);
          val.of.i64 = wasm_foreign_as_ref(uVar8);
          wasm_ref_set_host_info(expected,1);
          wasm_ref_set_host_info(val.of.i64,2);
          check((wasm_ref_t *)0x0,(wasm_ref_t *)0x0);
          pwVar9 = (wasm_ref_t *)wasm_ref_copy(expected);
          check(pwVar9,expected);
          pwVar9 = (wasm_ref_t *)wasm_ref_copy(val.of.i64);
          check(pwVar9,val.of.ref);
          ref._0_1_ = -0x80;
          val._0_8_ = wasm_ref_copy(expected);
          pwVar9 = (wasm_ref_t *)wasm_ref_copy(val._0_8_);
          check(pwVar9,expected);
          pwVar9 = (wasm_ref_t *)wasm_ref_copy(val._0_8_);
          check(pwVar9,expected);
          wasm_val_delete(&ref);
          printf("Accessing global...\n");
          pwVar9 = call_v_r(func_00);
          check(pwVar9,(wasm_ref_t *)0x0);
          call_r_v(func,expected);
          pwVar9 = call_v_r(func_00);
          check(pwVar9,expected);
          call_r_v(func,val.of.ref);
          pwVar9 = call_v_r(func_00);
          check(pwVar9,val.of.ref);
          call_r_v(func,(wasm_ref_t *)0x0);
          pwVar9 = call_v_r(func_00);
          check(pwVar9,(wasm_ref_t *)0x0);
          wasm_global_get(pwVar6,&ref);
          if ((char)ref != -0x80) {
            __assert_fail("val.kind == WASM_ANYREF",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/third_party/wasm-c-api/example/hostref.c"
                          ,0xe3,"int main(int, const char **)");
          }
          check((wasm_ref_t *)val._0_8_,(wasm_ref_t *)0x0);
          val._0_8_ = val.of;
          wasm_global_set(pwVar6,&ref);
          pwVar9 = call_v_r(func_00);
          check(pwVar9,val.of.ref);
          wasm_global_get(pwVar6,&ref);
          if ((char)ref != -0x80) {
            __assert_fail("val.kind == WASM_ANYREF",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/third_party/wasm-c-api/example/hostref.c"
                          ,0xe9,"int main(int, const char **)");
          }
          check((wasm_ref_t *)val._0_8_,val.of.ref);
          printf("Accessing table...\n");
          pwVar9 = call_i_r(func_02,0);
          check(pwVar9,(wasm_ref_t *)0x0);
          pwVar9 = call_i_r(func_02,1);
          check(pwVar9,(wasm_ref_t *)0x0);
          call_ir_v(func_01,0,expected);
          call_ir_v(func_01,1,val.of.ref);
          pwVar9 = call_i_r(func_02,0);
          check(pwVar9,expected);
          pwVar9 = call_i_r(func_02,1);
          check(pwVar9,val.of.ref);
          call_ir_v(func_01,0,(wasm_ref_t *)0x0);
          pwVar9 = call_i_r(func_02,0);
          check(pwVar9,(wasm_ref_t *)0x0);
          pwVar9 = (wasm_ref_t *)wasm_table_get(pwVar7,2);
          check(pwVar9,(wasm_ref_t *)0x0);
          wasm_table_set(pwVar7,2,expected);
          pwVar9 = call_i_r(func_02,2);
          check(pwVar9,expected);
          pwVar9 = (wasm_ref_t *)wasm_table_get(pwVar7,2);
          check(pwVar9,expected);
          printf("Accessing function...\n");
          pwVar9 = call_r_r(func_03,(wasm_ref_t *)0x0);
          check(pwVar9,(wasm_ref_t *)0x0);
          pwVar9 = call_r_r(func_03,expected);
          check(pwVar9,expected);
          pwVar9 = call_r_r(func_03,val.of.ref);
          check(pwVar9,val.of.ref);
          wasm_ref_delete(expected);
          wasm_ref_delete(val.of.i64);
          wasm_extern_vec_delete(&i);
          printf("Shutting down...\n");
          wasm_store_delete(uVar2);
          wasm_engine_delete(uVar1);
          printf("Done.\n");
          argv_local._4_4_ = 0;
        }
      }
    }
    else {
      printf("> Error loading module!\n");
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("hostref.wasm", "r");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external callback function.
  printf("Creating callback...\n");
  own wasm_functype_t* callback_type = wasm_functype_new_1_1(
    wasm_valtype_new(WASM_ANYREF), wasm_valtype_new(WASM_ANYREF));
  own wasm_func_t* callback_func =
    wasm_func_new(store, callback_type, callback);

  wasm_functype_delete(callback_type);

  // Instantiate.
  printf("Instantiating module...\n");
  const wasm_extern_t* imports[] = { wasm_func_as_extern(callback_func) };
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_func_delete(callback_func);
  wasm_module_delete(module);

  // Extract export.
  printf("Extracting exports...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  size_t i = 0;
  wasm_global_t* global = get_export_global(&exports, i++);
  wasm_table_t* table = get_export_table(&exports, i++);
  wasm_func_t* global_set = get_export_func(&exports, i++);
  wasm_func_t* global_get = get_export_func(&exports, i++);
  wasm_func_t* table_set = get_export_func(&exports, i++);
  wasm_func_t* table_get = get_export_func(&exports, i++);
  wasm_func_t* func_call = get_export_func(&exports, i++);

  wasm_instance_delete(instance);

  // Create host references.
  printf("Creating host references...\n");
  own wasm_ref_t* host1 = wasm_foreign_as_ref(wasm_foreign_new(store));
  own wasm_ref_t* host2 = wasm_foreign_as_ref(wasm_foreign_new(store));
  wasm_ref_set_host_info(host1, (void*)1);
  wasm_ref_set_host_info(host2, (void*)2);

  // Some sanity checks.
  check(NULL, NULL);
  check(wasm_ref_copy(host1), host1);
  check(wasm_ref_copy(host2), host2);

  own wasm_val_t val;
  val.kind = WASM_ANYREF;
  val.of.ref = wasm_ref_copy(host1);
  check(wasm_ref_copy(val.of.ref), host1);
  own wasm_ref_t* ref = val.of.ref;
  check(wasm_ref_copy(ref), host1);
  wasm_val_delete(&val);

  // Interact.
  printf("Accessing global...\n");
  check(call_v_r(global_get), NULL);
  call_r_v(global_set, host1);
  check(call_v_r(global_get), host1);
  call_r_v(global_set, host2);
  check(call_v_r(global_get), host2);
  call_r_v(global_set, NULL);
  check(call_v_r(global_get), NULL);

  wasm_global_get(global, &val);
  assert(val.kind == WASM_ANYREF);
  check(val.of.ref, NULL);
  val.of.ref = host2;
  wasm_global_set(global, &val);
  check(call_v_r(global_get), host2);
  wasm_global_get(global, &val);
  assert(val.kind == WASM_ANYREF);
  check(val.of.ref, host2);

  printf("Accessing table...\n");
  check(call_i_r(table_get, 0), NULL);
  check(call_i_r(table_get, 1), NULL);
  call_ir_v(table_set, 0, host1);
  call_ir_v(table_set, 1, host2);
  check(call_i_r(table_get, 0), host1);
  check(call_i_r(table_get, 1), host2);
  call_ir_v(table_set, 0, NULL);
  check(call_i_r(table_get, 0), NULL);

  check(wasm_table_get(table, 2), NULL);
  wasm_table_set(table, 2, host1);
  check(call_i_r(table_get, 2), host1);
  check(wasm_table_get(table, 2), host1);

  printf("Accessing function...\n");
  check(call_r_r(func_call, NULL), NULL);
  check(call_r_r(func_call, host1), host1);
  check(call_r_r(func_call, host2), host2);

  wasm_ref_delete(host1);
  wasm_ref_delete(host2);

  wasm_extern_vec_delete(&exports);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}